

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

StackSliceArray ts_stack_pop_pending(Stack *self,StackVersion version)

{
  uint32_t *puVar1;
  undefined8 *puVar2;
  StackHead *self_00;
  uint32_t uVar3;
  undefined4 uVar4;
  StackNode *pSVar5;
  undefined8 uVar6;
  StackIterator *pSVar7;
  StackIterator *pSVar8;
  Subtree *pSVar9;
  StackSlice *extraout_RAX;
  StackSlice *pSVar10;
  uint uVar11;
  SubtreeArray *pSVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  _Bool *p_Var13;
  Subtree SVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  StackNode *pSVar18;
  uint32_t uVar19;
  uint uVar20;
  StackSliceArray SVar21;
  SubtreeArray subtrees;
  byte local_89;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_40;
  ulong local_38;
  
  uVar11 = 0;
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
LAB_00130cf0:
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  pSVar5 = (self->heads).contents[version].node;
  if ((self->iterators).capacity == 0) {
    pSVar8 = (self->iterators).contents;
    if (pSVar8 == (StackIterator *)0x0) {
      pSVar8 = (StackIterator *)&DAT_00000008;
      uVar11 = 0x20;
      pSVar7 = (StackIterator *)calloc(8,0x20);
      if (pSVar7 == (StackIterator *)0x0) goto LAB_00130d14;
      uVar11 = 0;
    }
    else {
      uVar11 = 0x100;
      pSVar7 = (StackIterator *)realloc(pSVar8,0x100);
      if (pSVar7 == (StackIterator *)0x0) {
        ts_stack_pop_pending_cold_1();
LAB_00130d14:
        ts_stack_pop_pending_cold_5();
        pSVar10 = extraout_RAX;
        uVar17 = extraout_RDX;
        if (uVar11 != (uint)extraout_RDX) {
          if (uVar11 <= (uint)extraout_RDX) {
            __assert_fail("v2 < v1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x265,
                          "void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)");
          }
          if (*(uint *)&(pSVar8->subtrees).contents <= uVar11) {
            __assert_fail("(uint32_t)v1 < self->heads.size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x266,
                          "void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)");
          }
          puVar2 = (undefined8 *)((long)pSVar8->node->links + (ulong)uVar11 * 0x28 + -0x10);
          self_00 = (StackHead *)
                    ((long)pSVar8->node->links + (extraout_RDX & 0xffffffff) * 0x28 + -0x10);
          if ((self_00->summary != (StackSummary *)0x0) && (puVar2[2] == 0)) {
            puVar2[2] = self_00->summary;
            self_00->summary = (StackSummary *)0x0;
          }
          stack_head_delete(self_00,(StackNodeArray *)&pSVar8[1].subtrees.size,
                            (SubtreePool *)&(pSVar8[2].subtrees.contents)->data);
          *(undefined8 *)&self_00->status = puVar2[4];
          pSVar5 = (StackNode *)*puVar2;
          SVar14 = *(Subtree *)(puVar2 + 1);
          uVar6 = puVar2[3];
          self_00->summary = (StackSummary *)puVar2[2];
          self_00->node_count_at_last_error = (int)uVar6;
          self_00->lookahead_when_paused = (short)((ulong)uVar6 >> 0x20);
          *(short *)&self_00->field_0x1e = (short)((ulong)uVar6 >> 0x30);
          self_00->node = pSVar5;
          self_00->last_external_token = SVar14;
          uVar20 = *(uint *)&(pSVar8->subtrees).contents;
          if (uVar20 <= uVar11) {
            __assert_fail("index < self->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                          ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
          }
          pSVar10 = (StackSlice *)
                    memmove((void *)((long)pSVar8->node->links + (ulong)uVar11 * 0x28 + -0x10),
                            (void *)((long)pSVar8->node->links + (ulong)(uVar11 + 1) * 0x28 + -0x10)
                            ,(ulong)(uVar20 + ~uVar11) * 0x28);
          *(int *)&(pSVar8->subtrees).contents = *(int *)&(pSVar8->subtrees).contents + -1;
          uVar17 = extraout_RDX_00;
        }
        SVar21.size = (int)uVar17;
        SVar21.capacity = (int)(uVar17 >> 0x20);
        SVar21.contents = pSVar10;
        return SVar21;
      }
      uVar11 = (self->iterators).size;
    }
    (self->iterators).contents = pSVar7;
    (self->iterators).capacity = 8;
  }
  pSVar8 = (self->iterators).contents;
  (self->iterators).size = uVar11 + 1;
  pSVar8[uVar11].node = pSVar5;
  pSVar12 = &pSVar8[uVar11].subtrees;
  pSVar12->contents = (Subtree *)0x0;
  pSVar12->size = 0;
  pSVar12->capacity = 0;
  pSVar8[uVar11].subtree_count = 0;
  pSVar8[uVar11].is_pending = true;
  uVar19 = (self->iterators).size;
  if (uVar19 != 0) {
    uVar17 = 0;
    do {
      do {
        pSVar8 = (self->iterators).contents;
        pSVar5 = pSVar8[uVar17].node;
        if (pSVar8[uVar17].subtree_count == 0) {
          uVar15 = (ulong)pSVar5->link_count;
          if (pSVar5->link_count == 0) goto LAB_00130bff;
          p_Var13 = &pSVar5->links[1].is_pending;
          uVar16 = 0;
          local_38 = uVar17;
          do {
            uVar16 = uVar16 + 1;
            if (uVar16 == uVar15) {
              pSVar18 = pSVar5->links[0].node;
              SVar14 = pSVar5->links[0].subtree;
              local_89 = pSVar5->links[0].is_pending;
              pSVar8 = (self->iterators).contents + uVar17;
LAB_00130b08:
              pSVar8->node = pSVar18;
              if (SVar14.ptr == (SubtreeHeapData *)0x0) {
                pSVar8->subtree_count = pSVar8->subtree_count + 1;
              }
              else {
                uVar11 = (pSVar8->subtrees).size;
                if (uVar11 == (pSVar8->subtrees).capacity) {
                  uVar20 = uVar11 * 2;
                  if (uVar20 < 9) {
                    uVar20 = 8;
                  }
                  pSVar9 = (pSVar8->subtrees).contents;
                  if (uVar11 < uVar20) {
                    uVar15 = (ulong)uVar20;
                    if (pSVar9 == (Subtree *)0x0) {
                      local_40 = uVar15;
                      pSVar9 = (Subtree *)calloc(uVar15,8);
                      if (pSVar9 == (Subtree *)0x0) goto LAB_00130ce6;
                    }
                    else {
                      pSVar9 = (Subtree *)realloc(pSVar9,uVar15 << 3);
                      if (pSVar9 == (Subtree *)0x0) {
                        ts_stack_pop_pending_cold_3();
LAB_00130ce6:
                        ts_stack_pop_pending_cold_4();
                        goto LAB_00130cf0;
                      }
                      uVar11 = (pSVar8->subtrees).size;
                    }
                    (pSVar8->subtrees).contents = pSVar9;
                    (pSVar8->subtrees).capacity = uVar20;
                  }
                }
                else {
                  pSVar9 = (pSVar8->subtrees).contents;
                }
                (pSVar8->subtrees).size = uVar11 + 1;
                pSVar9[uVar11] = SVar14;
                ts_subtree_retain(SVar14);
                if (((ulong)SVar14.ptr & 1) == 0) {
                  uVar11 = *(uint *)&(SVar14.ptr)->field_0x2c >> 2;
                }
                else {
                  uVar11 = (uint)((ulong)SVar14.ptr >> 3) & 0x1fffffff;
                }
                if (((uVar11 & 1) != 0) ||
                   (pSVar8->subtree_count = pSVar8->subtree_count + 1, (local_89 & 1) != 0))
                goto LAB_00130bd8;
              }
              pSVar8->is_pending = false;
            }
            else {
              uVar11 = (self->iterators).size;
              if (uVar11 < 0x40) {
                pSVar18 = ((StackLink *)(p_Var13 + -0x10))->node;
                SVar14 = *(Subtree *)(p_Var13 + -8);
                local_89 = *p_Var13;
                pSVar8 = (self->iterators).contents;
                local_68._0_8_ = pSVar8[uVar17].node;
                local_68._8_8_ = pSVar8[uVar17].subtrees.contents;
                pSVar12 = &pSVar8[uVar17].subtrees;
                local_58._0_4_ = pSVar12->size;
                local_58._4_4_ = pSVar12->capacity;
                uStack_50 = pSVar12[1].contents;
                if (uVar11 == (self->iterators).capacity) {
                  uVar11 = uVar11 * 2;
                  if (uVar11 < 9) {
                    uVar11 = 8;
                  }
                  pSVar8 = (StackIterator *)realloc(pSVar8,(ulong)(uVar11 << 5));
                  if (pSVar8 == (StackIterator *)0x0) {
                    ts_stack_pop_pending_cold_2();
                    goto LAB_00130cbf;
                  }
                  (self->iterators).contents = pSVar8;
                  (self->iterators).capacity = uVar11;
                  uVar11 = (self->iterators).size;
                }
                (self->iterators).size = uVar11 + 1;
                pSVar12 = &pSVar8[uVar11].subtrees;
                pSVar12->size = (undefined4)local_58;
                pSVar12->capacity = local_58._4_4_;
                pSVar12[1].contents = uStack_50;
                pSVar8[uVar11].node = (StackNode *)local_68._0_8_;
                pSVar8[uVar11].subtrees.contents = (Subtree *)local_68._8_8_;
                uVar3 = (self->iterators).size;
                if (uVar3 == 0) {
                  __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                ,0x151,
                                "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                               );
                }
                uVar11 = uVar3 - 1;
                pSVar7 = (self->iterators).contents;
                pSVar8 = pSVar7 + uVar11;
                pSVar12 = &pSVar7[uVar11].subtrees;
                ts_subtree_array_copy(*pSVar12,pSVar12);
                goto LAB_00130b08;
              }
            }
LAB_00130bd8:
            uVar15 = (ulong)pSVar5->link_count;
            p_Var13 = p_Var13 + 0x18;
          } while (uVar16 < uVar15);
          uVar17 = (ulong)((int)local_38 + 1);
        }
        else {
          if (pSVar8[uVar17].is_pending == true) {
            local_68._0_8_ = pSVar8[uVar17].subtrees.contents;
            pSVar9 = *(Subtree **)&pSVar8[uVar17].subtrees.size;
            local_68._8_4_ = SUB84(pSVar9,0);
            if (1 < (uint)local_68._8_4_) {
              uVar11 = (uint)local_68._8_4_ >> 1;
              uVar15 = 0;
              do {
                local_68._8_4_ = local_68._8_4_ - 1;
                SVar14 = *(Subtree *)(local_68._0_8_ + uVar15 * 8);
                *(Subtree *)(local_68._0_8_ + uVar15 * 8) =
                     *(Subtree *)(local_68._0_8_ + (ulong)(uint)local_68._8_4_ * 8);
                *(Subtree *)(local_68._0_8_ + (ulong)(uint)local_68._8_4_ * 8) = SVar14;
                uVar15 = uVar15 + 1;
              } while (uVar11 != uVar15);
            }
            local_68._8_8_ = pSVar9;
            ts_stack__add_slice(self,version,pSVar5,(SubtreeArray *)local_68);
          }
          else {
LAB_00130bff:
            ts_subtree_array_delete(self->subtree_pool,&pSVar8[uVar17].subtrees);
          }
          uVar11 = (self->iterators).size;
          if (uVar11 <= (uint)uVar17) {
LAB_00130cbf:
            __assert_fail("index < self->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                          ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
          }
          pSVar8 = (self->iterators).contents;
          memmove(pSVar8 + uVar17,pSVar8 + uVar17 + 1,(ulong)(uVar11 + ~(uint)uVar17) << 5);
          puVar1 = &(self->iterators).size;
          *puVar1 = *puVar1 - 1;
          uVar19 = uVar19 - 1;
        }
      } while ((uint)uVar17 < uVar19);
      uVar19 = (self->iterators).size;
      uVar17 = 0;
    } while (uVar19 != 0);
  }
  pSVar10 = (self->slices).contents;
  uVar4 = (self->slices).size;
  SVar21 = self->slices;
  if (uVar4 != 0) {
    ts_stack_renumber_version(self,pSVar10->version,version);
    pSVar10->version = version;
  }
  return SVar21;
}

Assistant:

StackSliceArray ts_stack_pop_pending(Stack *self, StackVersion version) {
  StackSliceArray pop = stack__iter(self, version, pop_pending_callback, NULL, 0);
  if (pop.size > 0) {
    ts_stack_renumber_version(self, pop.contents[0].version, version);
    pop.contents[0].version = version;
  }
  return pop;
}